

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateValueFunctionWrapper
          (ExpressionContext *ctx,SynBase *source,SynBase *synValue,ExprBase *exprValue,
          InplaceStr functionName)

{
  uint uniqueId;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  TypeRef *contextType;
  undefined4 extraout_var_00;
  TypeBase **ppTVar5;
  TypeFunction *pTVar6;
  undefined4 extraout_var_01;
  SynBase *pSVar7;
  ExprVariableDefinition *pEVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var_02;
  VariableData *context;
  ExprVariableDefinition *first;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprError *this_00;
  char *pcVar10;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name;
  IntrusiveList<ExprBase> expressions;
  SmallArray<ArgumentData,_32U> arguments;
  FunctionData *this;
  
  bVar1 = AssertValueExpression(ctx,source,exprValue);
  if (bVar1) {
    SmallArray<ArgumentData,_32U>::SmallArray(&arguments,ctx->allocator);
    if ((ctx->scope == ctx->globalScope) || (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) {
      pTVar4 = ctx->typeVoid;
    }
    else {
      pTVar4 = CreateFunctionContextType(ctx,source,functionName);
    }
    contextType = ExpressionContext::GetReferenceType(ctx,pTVar4);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    SynIdentifier::SynIdentifier
              ((SynIdentifier *)CONCAT44(extraout_var_00,iVar2),source->begin,source->end,
               functionName);
    ppTVar5 = &exprValue->type;
    if (exprValue == (ExprBase *)0x0) {
      ppTVar5 = &ctx->typeAuto;
    }
    arguments_00._12_4_ = 0;
    arguments_00.data = arguments.data;
    arguments_00.count = arguments.count;
    pTVar6 = ExpressionContext::GetFunctionType(ctx,source,*ppTVar5,arguments_00);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
    this = (FunctionData *)CONCAT44(extraout_var_01,iVar3);
    uniqueId = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uniqueId + 1;
    pcVar10 = (char *)0x0;
    FunctionData::FunctionData
              (this,ctx->allocator,source,ctx->scope,false,false,false,pTVar6,
               &contextType->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var_00,iVar2),
               (IntrusiveList<MatchData>)ZEXT816(0),uniqueId);
    name.end = pcVar10;
    name.begin = (this->name->name).end;
    anon_unknown.dwarf_b837c::CheckFunctionConflict
              ((anon_unknown_dwarf_b837c *)ctx,(ExpressionContext *)source,
               (SynBase *)(this->name->name).begin,name);
    ExpressionContext::AddFunction(ctx,this);
    ExpressionContext::PushScope(ctx,this);
    this->functionScope = ctx->scope;
    pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar8 = CreateFunctionContextArgument(ctx,pSVar7,this);
    this->argumentsSize = this->functionScope->dataSize;
    expressions.head = (ExprBase *)0x0;
    expressions.tail = (ExprBase *)0x0;
    if (synValue == (SynBase *)0x0) {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar9 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
      pTVar4 = ctx->typeVoid;
      pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pSVar7 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar7,this,ctx->scope);
      pEVar9->typeID = 0x1c;
      pEVar9->source = source;
      pEVar9->type = pTVar4;
      pEVar9->next = (ExprBase *)0x0;
      pEVar9->listed = false;
      pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240b60;
      pEVar9[1]._vptr_ExprBase = (_func_int **)exprValue;
      *(undefined8 *)&pEVar9[1].typeID = 0;
      pEVar9[1].source = pSVar7;
    }
    else {
      pEVar9 = AnalyzeExpression(ctx,synValue);
      pEVar9 = CreateReturn(ctx,source,pEVar9);
    }
    IntrusiveList<ExprBase>::push_back(&expressions,pEVar9);
    ClosePendingUpvalues(ctx,this);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    if ((ctx->scope == ctx->globalScope) || (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) {
      context = (VariableData *)0x0;
      first = (ExprVariableDefinition *)0x0;
    }
    else {
      context = CreateFunctionContextVariable(ctx,source,this,(FunctionData *)0x0);
      first = CreateFunctionContextVariableDefinition(ctx,source,this,(FunctionData *)0x0,context);
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
    pTVar6 = this->type;
    pEVar9->typeID = 0x24;
    pEVar9->source = source;
    pEVar9->type = &pTVar6->super_TypeBase;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240b98;
    pEVar9[1]._vptr_ExprBase = (_func_int **)this;
    *(ExprVariableDefinition **)&pEVar9[1].typeID = pEVar8;
    pEVar9[1].source = (SynBase *)0x0;
    pEVar9[1].type = (TypeBase *)0x0;
    pEVar9[1].next = (ExprBase *)0x0;
    *(ExprBase **)&pEVar9[1].listed = expressions.head;
    pEVar9[2]._vptr_ExprBase = (_func_int **)expressions.tail;
    *(ExprVariableDefinition **)&pEVar9[2].typeID = first;
    pEVar9[2].source = (SynBase *)context;
    this->declaration = pEVar9;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&this->declaration);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this_00 = (ExprError *)CONCAT44(extraout_var_04,iVar2);
    pTVar6 = this->type;
    pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar9 = CreateFunctionContextAccess(ctx,pSVar7,this);
    ExprFunctionAccess::ExprFunctionAccess
              ((ExprFunctionAccess *)this_00,source,&pTVar6->super_TypeBase,this,pEVar9);
    if (first != (ExprVariableDefinition *)0x0) {
      this_00 = (ExprError *)CreateSequence(ctx,source,&first->super_ExprBase,(ExprBase *)this_00);
    }
    SmallArray<ArgumentData,_32U>::~SmallArray(&arguments);
  }
  else {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    this_00 = (ExprError *)CONCAT44(extraout_var,iVar2);
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError(this_00,source,pTVar4,exprValue);
  }
  return &this_00->super_ExprBase;
}

Assistant:

ExprBase* CreateValueFunctionWrapper(ExpressionContext &ctx, SynBase *source, SynBase *synValue, ExprBase *exprValue, InplaceStr functionName)
{
	if(!AssertValueExpression(ctx, source, exprValue))
		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType(), exprValue);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	TypeBase *contextRefType = NULL;

	if(ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace)
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(source->begin, source->end, functionName);

	TypeFunction *typeFunction = ctx.GetFunctionType(source, exprValue ? exprValue->type : ctx.typeAuto, arguments);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, typeFunction, contextRefType, functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	IntrusiveList<ExprBase> expressions;

	if (synValue)
		expressions.push_back(CreateReturn(ctx, source, AnalyzeExpression(ctx, synValue)));
	else
		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, exprValue, NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(ctx.scope != ctx.globalScope && !ctx.scope->ownerNamespace)
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, function->type, function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), function));

	if(!contextVariableDefinition)
		return access;

	return CreateSequence(ctx, source, contextVariableDefinition, access);
}